

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeparser.cpp
# Opt level: O2

void __thiscall QMakeParser::putHashStr(QMakeParser *this,ushort **pTokPtr,ushort *buf,uint len)

{
  ushort *puVar1;
  size_t sVar2;
  
  sVar2 = ProString::hash((QChar *)buf,len);
  puVar1 = *pTokPtr;
  *puVar1 = (ushort)sVar2;
  puVar1[1] = (ushort)(sVar2 >> 0x10);
  puVar1[2] = (ushort)len;
  if (len != 0) {
    memcpy(puVar1 + 3,buf,(ulong)(len * 2));
  }
  *pTokPtr = puVar1 + 3 + len;
  return;
}

Assistant:

void QMakeParser::putHashStr(ushort *&pTokPtr, const ushort *buf, uint len)
{
    const size_t hash = ProString::hash((const QChar *)buf, len);
    ushort *tokPtr = pTokPtr;
    *tokPtr++ = (ushort)hash;
    *tokPtr++ = (ushort)(hash >> 16);
    *tokPtr++ = (ushort)len;
    if (len) // buf may be nullptr; don't pass that to memcpy (-> undefined behavior)
        memcpy(tokPtr, buf, len * 2);
    pTokPtr = tokPtr + len;
}